

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataCube.cpp
# Opt level: O2

void __thiscall DataCube::loadFeatures(DataCube *this)

{
  bool bVar1;
  int iVar2;
  size_t *__s;
  istream *piVar3;
  size_t sVar4;
  size_t sVar5;
  var_bitset *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  int iVar6;
  int numOfFeatures;
  int degreeOfInteractions;
  string attrName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  string rootName;
  string typeOfFeature;
  string line;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3d8;
  int *local_3d0 [2];
  stringstream ssLine;
  ostream local_3b0 [376];
  ifstream input;
  byte abStack_218 [488];
  
  __s = (size_t *)operator_new__(800);
  memset(__s,0,800);
  this->_queryRootIndex = __s;
  std::ifstream::ifstream(&input,(string *)multifaq::config::FEATURE_CONF_abi_cxx11_,_S_in);
  if ((abStack_218[*(long *)(_input + -0x18)] & 5) == 0) {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    std::__cxx11::stringstream::stringstream((stringstream *)&ssLine);
    numOfFeatures = 0;
    degreeOfInteractions = 0;
    do {
      do {
        piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&input,(string *)&line);
        if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) goto LAB_001772a3;
      } while (*line._M_dataplus._M_p == '#');
      bVar1 = std::operator==(&line,"");
    } while (bVar1);
LAB_001772a3:
    local_3d8._M_current = line._M_dataplus._M_p;
    local_478._M_dataplus._M_p = (pointer)&numOfFeatures;
    rootName._M_string_length = (size_type)&local_478;
    typeOfFeature._M_dataplus._M_p = (pointer)&rootName;
    rootName._M_dataplus._M_p = &boost::spirit::int_;
    attrName._M_dataplus._M_p = (pointer)&typeOfFeature;
    typeOfFeature._M_string_length = (size_type)&NUMBER_SEPARATOR_CHAR;
    local_3d0[0] = &degreeOfInteractions;
    local_498._M_string_length = (size_type)local_3d0;
    attrName._M_string_length = (size_type)&local_498;
    local_498._M_dataplus._M_p = &boost::spirit::int_;
    iVar6 = 0;
    boost::spirit::qi::
    phrase_parse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::int_>const&,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<int>>,0l>>,boost::phoenix::actor<boost::spirit::argument<0>>>,2l>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::int_>const&,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<int>>,0l>>,boost::phoenix::actor<boost::spirit::argument<0>>>,2l>>const&>,2l>const&>,2l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>>
              (&local_3d8,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(line._M_dataplus._M_p + line._M_string_length),
               (expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::int_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<int>_>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::int_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<int>_>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&>,_2L>
                *)&attrName,
               (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>
                *)&boost::spirit::ascii::space,postskip);
    while( true ) {
      do {
        do {
          if (numOfFeatures <= iVar6) {
            std::__cxx11::stringstream::~stringstream((stringstream *)&ssLine);
            std::__cxx11::string::~string((string *)&line);
            std::ifstream::~ifstream(&input);
            return;
          }
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&input,(string *)&line);
        } while (*line._M_dataplus._M_p == '#');
        bVar1 = std::operator==(&line,"");
      } while (bVar1);
      std::operator<<(local_3b0,(string *)&line);
      attrName._M_dataplus._M_p = (pointer)&attrName.field_2;
      attrName._M_string_length = 0;
      attrName.field_2._M_local_buf[0] = '\0';
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&ssLine,(string *)&attrName,':');
      typeOfFeature._M_dataplus._M_p = (pointer)&typeOfFeature.field_2;
      typeOfFeature._M_string_length = 0;
      typeOfFeature.field_2._M_local_buf[0] = '\0';
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&ssLine,(string *)&typeOfFeature,':');
      rootName._M_dataplus._M_p = (pointer)&rootName.field_2;
      rootName._M_string_length = 0;
      rootName.field_2._M_local_buf[0] = '\0';
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&ssLine,(string *)&rootName,':');
      sVar4 = TreeDecomposition::getAttributeIndex
                        ((this->_td).
                         super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         &attrName);
      iVar2 = std::__cxx11::stoi(&typeOfFeature,(size_t *)0x0,10);
      sVar5 = TreeDecomposition::getRelationIndex
                        ((this->_td).
                         super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         &rootName);
      if ((int)sVar4 == -1) break;
      if ((int)sVar5 == -1) {
        std::operator+(&local_498,"Relation |",&rootName);
        std::operator+(&local_478,&local_498,"| does not exist.");
        std::operator<<((ostream *)&std::cerr,(string *)&local_478);
        goto LAB_0017769f;
      }
      sVar4 = (size_t)(int)sVar4;
      if ((iVar6 == 0) && (this->_labelID = sVar4, iVar2 == 1)) {
        std::operator<<((ostream *)&std::cerr,"The Measure of a DataCube should be continuous!\n");
        goto LAB_001776b3;
      }
      std::bitset<100UL>::set(&(this->super_Application)._isFeature,sVar4,true);
      std::bitset<100UL>::set(&(this->super_Application)._features,sVar4,true);
      if (iVar2 == 1) {
        this->_queryRootIndex[sVar4] = (long)(int)sVar5;
        this_00 = &(this->super_Application)._isCategoricalFeature;
LAB_00177531:
        std::bitset<100UL>::set(this_00,sVar4,true);
      }
      else {
        this_00 = &this->_measures;
        if (iVar2 == 2 || iVar6 == 0) goto LAB_00177531;
        this->_queryRootIndex[sVar4] =
             ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->_root->_id;
      }
      std::ios::clear((int)*(undefined8 *)(_ssLine + -0x18) + (int)&ssLine);
      std::__cxx11::string::~string((string *)&rootName);
      std::__cxx11::string::~string((string *)&typeOfFeature);
      std::__cxx11::string::~string((string *)&attrName);
      iVar6 = iVar6 + 1;
    }
    std::operator+(&local_498,"Attribute |",&attrName);
    std::operator+(&local_478,&local_498,"| does not exist.");
    std::operator<<((ostream *)&std::cerr,(string *)&local_478);
LAB_0017769f:
    std::__cxx11::string::~string((string *)&local_478);
    this_01 = &local_498;
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ssLine,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   multifaq::config::FEATURE_CONF_abi_cxx11_," does not exist. \n");
    std::operator<<((ostream *)&std::cerr,(string *)&ssLine);
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ssLine;
  }
  std::__cxx11::string::~string((string *)this_01);
LAB_001776b3:
  exit(1);
}

Assistant:

void DataCube::loadFeatures()
{
    _queryRootIndex = new size_t[NUM_OF_VARIABLES]();
    
    /* Load the two-pass variables config file into an input stream. */
    ifstream input(FEATURE_CONF);

    if (!input)
    {
        ERROR(FEATURE_CONF + " does not exist. \n");
        exit(1);
    }

    /* String and associated stream to receive lines from the file. */
    string line;
    stringstream ssLine;

    int numOfFeatures = 0;
    int degreeOfInteractions = 0;
    
    /* Ignore comment and empty lines at the top */
    while (getline(input, line))
    {
        if (line[0] == COMMENT_CHAR || line == "")
            continue;

        break;
    }
    
    /* 
     * Extract number of labels, features and interactions from the config. 
     * Parse the line with the three numbers; ignore spaces. 
     */
    bool parsingSuccess =
        qi::phrase_parse(line.begin(), line.end(),
                         /* Begin Boost Spirit grammar. */
                         ((qi::int_[phoenix::ref(numOfFeatures) = qi::_1])
                          >> NUMBER_SEPARATOR_CHAR
                          >> (qi::int_[phoenix::ref(degreeOfInteractions) =
                                       qi::_1])),
                         /*  End grammar. */
                         ascii::space);

    assert(parsingSuccess && "The parsing of the features file has failed.");
    
    /* Read in the features. */
    for (int featureNo = 0; featureNo < numOfFeatures; ++featureNo)
    {
        getline(input, line);
        if (line[0] == COMMENT_CHAR || line == "")
        {
            --featureNo;
            continue;
        }

        ssLine << line;
 
        string attrName;
        /* Extract the name of the attribute in the current line. */
        getline(ssLine, attrName, ATTRIBUTE_NAME_CHAR);

        string typeOfFeature;
        /* Extract the dimension of the current attribute. */
        getline(ssLine, typeOfFeature, ATTRIBUTE_NAME_CHAR);

        string rootName;
        /* Extract the dimension of the current attribute. */
        getline(ssLine, rootName, ATTRIBUTE_NAME_CHAR);

        int attributeID = _td->getAttributeIndex(attrName);
        int categorical = stoi(typeOfFeature); 
        int rootID = _td->getRelationIndex(rootName);

        if (attributeID == -1)
        {
            ERROR("Attribute |"+attrName+"| does not exist.");
            exit(1);
        }
        if (rootID == -1)
        {
            ERROR("Relation |"+rootName+"| does not exist.");
            exit(1);
        }
        if (featureNo == 0)
        {
            _labelID = attributeID;

            if (categorical == 1)
            {
                ERROR("The Measure of a DataCube should be continuous!\n");
                exit(1);
            }
        }

        _isFeature.set(attributeID);
        _features.set(attributeID);

        if (categorical == 1)
        {
            _queryRootIndex[attributeID] = rootID;
            _isCategoricalFeature.set(attributeID);
        }
        else if (categorical == 2 || featureNo == 0)
        {
            _measures.set(attributeID);
        }
        else
        {
            _queryRootIndex[attributeID] = _td->_root->_id;
        }

        /* Clear string stream. */
        ssLine.clear();
    }
}